

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

void __thiscall
kratos::ForStmt::ForStmt(ForStmt *this,string *iter_var_name,int64_t start,int64_t end,int64_t step)

{
  element_type *peVar1;
  bool local_71;
  shared_ptr<kratos::ScopedStmtBlock> local_70 [2];
  undefined1 local_50 [32];
  int64_t iStack_30;
  bool sign;
  int64_t step_local;
  int64_t end_local;
  int64_t start_local;
  string *iter_var_name_local;
  ForStmt *this_local;
  
  iStack_30 = step;
  step_local = end;
  end_local = start;
  start_local = (int64_t)iter_var_name;
  iter_var_name_local = (string *)this;
  Stmt::Stmt(&this->super_Stmt,For);
  (this->super_Stmt).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_005b7f70;
  std::shared_ptr<kratos::IterVar>::shared_ptr(&this->iter_);
  this->start_ = end_local;
  this->end_ = step_local;
  this->step_ = iStack_30;
  std::shared_ptr<kratos::ScopedStmtBlock>::shared_ptr(&this->loop_body_);
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  vector(&this->gen_var_stmts_);
  local_71 = end_local < 0 || step_local < 0;
  local_50[0x1f] = local_71;
  local_50._0_8_ = 0;
  std::make_shared<kratos::IterVar,decltype(nullptr),std::__cxx11::string_const&,long&,long&,bool&>
            ((void **)(local_50 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
             (long *)start_local,&end_local,(bool *)&step_local);
  std::shared_ptr<kratos::IterVar>::operator=
            (&this->iter_,(shared_ptr<kratos::IterVar> *)(local_50 + 8));
  std::shared_ptr<kratos::IterVar>::~shared_ptr((shared_ptr<kratos::IterVar> *)(local_50 + 8));
  std::make_shared<kratos::ScopedStmtBlock>();
  std::shared_ptr<kratos::ScopedStmtBlock>::operator=(&this->loop_body_,local_70);
  std::shared_ptr<kratos::ScopedStmtBlock>::~shared_ptr(local_70);
  peVar1 = std::
           __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->loop_body_);
  (*(peVar1->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[7])(peVar1,this);
  return;
}

Assistant:

ForStmt::ForStmt(const std::string &iter_var_name, int64_t start, int64_t end, int64_t step)
    : Stmt(StatementType::For), start_(start), end_(end), step_(step) {
    // making a loop variable
    // first determine if it is signed or not
    bool sign = start < 0 || end < 0;
    // the iter var used for iteration assignment
    iter_ = std::make_shared<IterVar>(nullptr, iter_var_name, start, end, sign);
    loop_body_ = std::make_shared<ScopedStmtBlock>();
    loop_body_->set_parent(this);
}